

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_str_errorfn(arg_str *parent,arg_dstr_t ds,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *str;
  char *datatype;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  datatype = (parent->hdr).datatype;
  arg_dstr_catf(ds,"%s: ",progname);
  if (errorcode == 2) {
    datatype = "";
    if (argval != (char *)0x0) {
      datatype = argval;
    }
    str = "excess option ";
  }
  else {
    if (errorcode != 1) {
      return;
    }
    str = "missing option ";
  }
  arg_dstr_cat(ds,str);
  arg_print_option_ds(ds,shortopts,longopts,datatype,"\n");
  return;
}

Assistant:

static void arg_str_errorfn(struct arg_str* parent, arg_dstr_t ds, int errorcode, const char* argval, const char* progname) {
    const char* shortopts = parent->hdr.shortopts;
    const char* longopts = parent->hdr.longopts;
    const char* datatype = parent->hdr.datatype;

    /* make argval NULL safe */
    argval = argval ? argval : "";

    arg_dstr_catf(ds, "%s: ", progname);
    switch (errorcode) {
        case ARG_ERR_MINCOUNT:
            arg_dstr_cat(ds, "missing option ");
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            break;

        case ARG_ERR_MAXCOUNT:
            arg_dstr_cat(ds, "excess option ");
            arg_print_option_ds(ds, shortopts, longopts, argval, "\n");
            break;
    }
}